

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O3

char * cppcms::http::response::status_to_string(int status)

{
  if (status < 300) {
    switch(status) {
    case 200:
      return "OK";
    case 0xc9:
      return "Created";
    case 0xca:
      return "Accepted";
    case 0xcb:
      return "Non-Authoritative Information";
    case 0xcc:
      return "No Content";
    case 0xcd:
      return "Reset Content";
    case 0xce:
      return "Partial Content";
    }
    if (status == 100) {
      return "Continue";
    }
    if (status == 0x65) {
      return "Switching Protocols";
    }
  }
  else {
    switch(status) {
    case 400:
      return "Bad Request";
    case 0x191:
      return "Unauthorized";
    case 0x192:
      return "Payment Required";
    case 0x193:
      return "Forbidden";
    case 0x194:
      return "Not Found";
    case 0x195:
      return "Method Not Allowed";
    case 0x196:
      return "Not Acceptable";
    case 0x197:
      return "Proxy Authentication Required";
    case 0x198:
      return "Request Time-out";
    case 0x199:
      return "Conflict";
    case 0x19a:
      return "Gone";
    case 0x19b:
      return "Length Required";
    case 0x19c:
      return "Precondition Failed";
    case 0x19d:
      return "Request Entity Too Large";
    case 0x19e:
      return "Request-URI Too Large";
    case 0x19f:
      return "Unsupported Media Type";
    case 0x1a0:
      return "Requested range not satisfiable";
    case 0x1a1:
      return "Expectation Failed";
    }
    switch(status) {
    case 300:
      return "Multiple Choices";
    case 0x12d:
      return "Moved Permanently";
    case 0x12e:
      return "Found";
    case 0x12f:
      return "See Other";
    case 0x130:
      return "Not Modified";
    case 0x131:
      return "Use Proxy";
    case 0x132:
      break;
    case 0x133:
      return "Temporary Redirect";
    default:
      switch(status) {
      case 500:
        return "Internal Server Error";
      case 0x1f5:
        return "Not Implemented";
      case 0x1f6:
        return "Bad Gateway";
      case 0x1f7:
        return "Service Unavailable";
      case 0x1f8:
        return "Gateway Time-out";
      case 0x1f9:
        return "HTTP Version not supported";
      }
    }
  }
  return "Unknown";
}

Assistant:

char const *response::status_to_string(int status)
{
	switch(status) {
	case 100: return "Continue";
 	case 101: return "Switching Protocols";
 	case 200: return "OK";
 	case 201: return "Created";
 	case 202: return "Accepted";
 	case 203: return "Non-Authoritative Information";
 	case 204: return "No Content";
 	case 205: return "Reset Content";
 	case 206: return "Partial Content";
 	case 300: return "Multiple Choices";
 	case 301: return "Moved Permanently";
 	case 302: return "Found";
 	case 303: return "See Other";
 	case 304: return "Not Modified";
 	case 305: return "Use Proxy";
 	case 307: return "Temporary Redirect";
 	case 400: return "Bad Request";
 	case 401: return "Unauthorized";
 	case 402: return "Payment Required";
 	case 403: return "Forbidden";
 	case 404: return "Not Found";
 	case 405: return "Method Not Allowed";
 	case 406: return "Not Acceptable";
 	case 407: return "Proxy Authentication Required";
 	case 408: return "Request Time-out";
 	case 409: return "Conflict";
 	case 410: return "Gone";
 	case 411: return "Length Required";
 	case 412: return "Precondition Failed";
 	case 413: return "Request Entity Too Large";
 	case 414: return "Request-URI Too Large";
 	case 415: return "Unsupported Media Type";
 	case 416: return "Requested range not satisfiable";
 	case 417: return "Expectation Failed";
 	case 500: return "Internal Server Error";
 	case 501: return "Not Implemented";
 	case 502: return "Bad Gateway";
 	case 503: return "Service Unavailable";
 	case 504: return "Gateway Time-out";
 	case 505: return "HTTP Version not supported";
	default:  return "Unknown";
	}
}